

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
EditingIterator::RemoveCurrent<Memory::NoThrowHeapAllocator>
          (EditingIterator *this,NoThrowHeapAllocator *allocator)

{
  RealCount *pRVar1;
  undefined4 *puVar2;
  NodeBase *buffer;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar3;
  code *pcVar4;
  bool bVar5;
  undefined8 *in_FS_OFFSET;
  
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar5) goto LAB_0025d117;
    *puVar2 = 0;
  }
  if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
      (this->super_Iterator).current == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar5) {
LAB_0025d117:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  buffer = (this->super_Iterator).current;
  pDVar3 = (buffer->prev).base;
  pDVar3->next = buffer->next;
  ((buffer->next).base)->prev = buffer->prev;
  Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>::~SegmentBase
            ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)(buffer + 1));
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x98);
  (this->super_Iterator).current = pDVar3;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }